

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# union_tag.cpp
# Opt level: O3

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> __thiscall
duckdb::UnionTagBind
          (duckdb *this,ClientContext *context,ScalarFunction *bound_function,
          vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
          *arguments)

{
  PhysicalType PVar1;
  pointer __src;
  size_type sVar2;
  _Head_base<0UL,_duckdb::FunctionData_*,_false> _Var3;
  uint uVar4;
  reference pvVar5;
  pointer pEVar6;
  idx_t capacity;
  reference pvVar7;
  string *psVar8;
  ParameterNotResolvedException *this_00;
  BinderException *pBVar9;
  InternalException *this_01;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  *pvVar10;
  undefined8 uVar11;
  idx_t i;
  idx_t index;
  long lVar12;
  anon_union_16_2_67f50693_for_value aVar13;
  string_t data;
  LogicalType enum_type;
  Vector varchar_vector;
  LogicalType local_d8;
  ScalarFunction *local_c0;
  _Head_base<0UL,_duckdb::FunctionData_*,_false> local_b8;
  Vector local_b0;
  LogicalType local_48;
  
  local_c0 = bound_function;
  if ((arguments->
      super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ).
      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      (arguments->
      super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ).
      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pBVar9 = (BinderException *)__cxa_allocate_exception(0x10);
    local_b0._0_8_ = &local_b0.type.type_info_;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_b0,"Missing required arguments for union_tag function.","");
    BinderException::BinderException(pBVar9,(string *)&local_b0);
    __cxa_throw(pBVar9,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
  }
  pvVar10 = arguments;
  pvVar5 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
           ::operator[](arguments,0);
  pEVar6 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     (pvVar5);
  if ((pEVar6->return_type).id_ == UNKNOWN) {
    this_00 = (ParameterNotResolvedException *)__cxa_allocate_exception(0x10);
    ParameterNotResolvedException::ParameterNotResolvedException(this_00);
    __cxa_throw(this_00,&ParameterNotResolvedException::typeinfo,
                ::std::runtime_error::~runtime_error);
  }
  pvVar5 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
           ::operator[](arguments,0);
  pEVar6 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     (pvVar5);
  if ((pEVar6->return_type).id_ != UNION) {
    pBVar9 = (BinderException *)__cxa_allocate_exception(0x10);
    local_b0._0_8_ = &local_b0.type.type_info_;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_b0,"First argument to union_tag function must be a union type.","");
    BinderException::BinderException(pBVar9,(string *)&local_b0);
    __cxa_throw(pBVar9,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
  }
  if ((ulong)((long)(arguments->
                    super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                    ).
                    super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
             (long)(arguments->
                   super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                   ).
                   super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                   ._M_impl.super__Vector_impl_data._M_start) < 9) {
    local_b8._M_head_impl = (FunctionData *)this;
    pvVar5 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
             ::operator[](arguments,0);
    pEVar6 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->(pvVar5);
    capacity = UnionType::GetMemberCount(&pEVar6->return_type);
    if (capacity != 0) {
      pvVar5 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
               ::operator[](arguments,0);
      pEVar6 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator->(pvVar5);
      pvVar7 = vector<duckdb::LogicalType,_true>::operator[]
                         (&(local_c0->super_BaseScalarFunction).super_SimpleFunction.arguments,0);
      if (pvVar7 != &pEVar6->return_type) {
        pvVar7->id_ = (pEVar6->return_type).id_;
        PVar1 = (pEVar6->return_type).physical_type_;
        pvVar10 = (vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                   *)CONCAT71((int7)((ulong)pvVar10 >> 8),PVar1);
        pvVar7->physical_type_ = PVar1;
        shared_ptr<duckdb::ExtraTypeInfo,_true>::operator=
                  (&pvVar7->type_info_,&(pEVar6->return_type).type_info_);
      }
      LogicalType::LogicalType(&local_48,VARCHAR);
      Vector::Vector(&local_b0,&local_48,capacity);
      LogicalType::~LogicalType(&local_48);
      lVar12 = 8;
      index = 0;
      do {
        pvVar5 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                 ::operator[](arguments,0);
        pEVar6 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                 operator->(pvVar5);
        psVar8 = UnionType::GetMemberName_abi_cxx11_(&pEVar6->return_type,index);
        __src = (psVar8->_M_dataplus)._M_p;
        sVar2 = psVar8->_M_string_length;
        uVar4 = (uint)sVar2;
        local_d8.id_ = (LogicalTypeId)sVar2;
        local_d8.physical_type_ = (PhysicalType)(sVar2 >> 8);
        local_d8._2_2_ = SUB82(sVar2 >> 0x10,0);
        if (uVar4 < 0xd) {
          local_d8.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ = 0;
          local_d8._4_4_ = 0;
          local_d8.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 0;
          if (uVar4 == 0) {
            uVar11 = 0;
          }
          else {
            switchD_00b03519::default(&local_d8.field_0x4,__src,(ulong)(uVar4 & 0xf));
            uVar11 = CONCAT44(local_d8.type_info_.internal.
                              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr._4_4_,
                              local_d8.type_info_.internal.
                              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr._0_4_);
          }
          aVar13.pointer.length._1_1_ = local_d8.physical_type_;
          aVar13.pointer.length._0_1_ = local_d8.id_;
          aVar13.pointer.length._2_2_ = local_d8._2_2_;
          aVar13._4_1_ = local_d8._4_1_;
          aVar13._5_1_ = local_d8._5_1_;
          aVar13._6_1_ = local_d8._6_1_;
          aVar13._7_1_ = local_d8._7_1_;
          aVar13.pointer.ptr = (char *)uVar11;
        }
        else {
          local_d8._4_1_ = __src[0];
          local_d8._5_1_ = __src[1];
          local_d8._6_1_ = __src[2];
          local_d8._7_1_ = __src[3];
          local_d8.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ =
               SUB84(__src,0);
          local_d8.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ =
               (undefined4)((ulong)__src >> 0x20);
          data.value.pointer.ptr = (char *)pvVar10;
          data.value._0_8_ = __src;
          aVar13.pointer =
               (anon_struct_16_3_d7536bce_for_pointer)
               StringVector::AddString
                         ((StringVector *)&local_b0,(Vector *)CONCAT44(local_d8._4_4_,uVar4),data);
        }
        *(long *)((long)local_b0.data + lVar12 + -8) = aVar13._0_8_;
        *(char **)((long)&(((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                             *)local_b0.data)->
                          super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                          )._M_impl.super__Vector_impl_data._M_start + lVar12) = aVar13.pointer.ptr;
        index = index + 1;
        lVar12 = lVar12 + 0x10;
        pvVar10 = (vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                   *)local_b0.data;
      } while (capacity != index);
      LogicalType::ENUM(&local_d8,&local_b0,capacity);
      if (&(local_c0->super_BaseScalarFunction).return_type != &local_d8) {
        (local_c0->super_BaseScalarFunction).return_type.id_ = local_d8.id_;
        (local_c0->super_BaseScalarFunction).return_type.physical_type_ = local_d8.physical_type_;
        shared_ptr<duckdb::ExtraTypeInfo,_true>::operator=
                  (&(local_c0->super_BaseScalarFunction).return_type.type_info_,&local_d8.type_info_
                  );
      }
      _Var3._M_head_impl = local_b8._M_head_impl;
      (local_b8._M_head_impl)->_vptr_FunctionData = (_func_int **)0x0;
      LogicalType::~LogicalType(&local_d8);
      if (local_b0.auxiliary.internal.
          super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_b0.auxiliary.internal.
                   super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi);
      }
      if (local_b0.buffer.internal.
          super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_b0.buffer.internal.
                   super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi);
      }
      if (local_b0.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_b0.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.
                   internal.
                   super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      LogicalType::~LogicalType((LogicalType *)((long)&local_b0 + 8));
      return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
             (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
             _Var3._M_head_impl;
    }
    this_01 = (InternalException *)__cxa_allocate_exception(0x10);
    local_b0._0_8_ = &local_b0.type.type_info_;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_b0,"Can\'t get tags from an empty union","");
    InternalException::InternalException(this_01,(string *)&local_b0);
    __cxa_throw(this_01,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  }
  pBVar9 = (BinderException *)__cxa_allocate_exception(0x10);
  local_b0._0_8_ = &local_b0.type.type_info_;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_b0,"Too many arguments, union_tag takes at most one argument.","");
  BinderException::BinderException(pBVar9,(string *)&local_b0);
  __cxa_throw(pBVar9,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

static unique_ptr<FunctionData> UnionTagBind(ClientContext &context, ScalarFunction &bound_function,
                                             vector<unique_ptr<Expression>> &arguments) {

	if (arguments.empty()) {
		throw BinderException("Missing required arguments for union_tag function.");
	}

	if (LogicalTypeId::UNKNOWN == arguments[0]->return_type.id()) {
		throw ParameterNotResolvedException();
	}

	if (LogicalTypeId::UNION != arguments[0]->return_type.id()) {
		throw BinderException("First argument to union_tag function must be a union type.");
	}

	if (arguments.size() > 1) {
		throw BinderException("Too many arguments, union_tag takes at most one argument.");
	}

	auto member_count = UnionType::GetMemberCount(arguments[0]->return_type);
	if (member_count == 0) {
		// this should never happen, empty unions are not allowed
		throw InternalException("Can't get tags from an empty union");
	}

	bound_function.arguments[0] = arguments[0]->return_type;

	auto varchar_vector = Vector(LogicalType::VARCHAR, member_count);
	for (idx_t i = 0; i < member_count; i++) {
		auto str = string_t(UnionType::GetMemberName(arguments[0]->return_type, i));
		FlatVector::GetData<string_t>(varchar_vector)[i] =
		    str.IsInlined() ? str : StringVector::AddString(varchar_vector, str);
	}
	auto enum_type = LogicalType::ENUM(varchar_vector, member_count);
	bound_function.return_type = enum_type;

	return nullptr;
}